

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xml.h
# Opt level: O0

void __thiscall asl::XmlCodec::~XmlCodec(XmlCodec *this)

{
  XmlCodec *this_local;
  
  asl::String::~String(&this->_xml);
  return;
}

Assistant:

class ASL_API XmlCodec
{
	String _xml;
	bool _formatted;
	int _level;
public:
	XmlCodec()
	{
		_formatted = true;
		_level = 0;
	}

	void setFormatted(bool on) { _formatted = on; }

	const String& text() const { return _xml; }

	void escape(const String& s);

	void encode(const Xml& e);
}